

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O1

Gia_Man_t *
Gia_ManLutBalance(Gia_Man_t *p,int nLutSize,int fUseMuxes,int fRecursive,int fOptArea,int fVerbose)

{
  int *__ptr;
  int iVar1;
  Tim_Man_t *pTVar2;
  Gia_Man_t *p_00;
  Str_Ntk_t *p_01;
  Gia_Man_t *p_02;
  Gia_Man_t *p_03;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_48;
  Tim_Man_t *local_38;
  
  p_01 = (Str_Ntk_t *)(ulong)(uint)fOptArea;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if ((((Tim_Man_t *)p->pManTime == (Tim_Man_t *)0x0) ||
      (iVar1 = Tim_ManBoxNum((Tim_Man_t *)p->pManTime), iVar1 == 0)) ||
     (iVar1 = Gia_ManIsNormalized(p), iVar1 == 0)) {
    p_01 = Str_ManNormalize(p);
    p_03 = Str_NtkBalance(p,p_01,nLutSize,fUseMuxes,fRecursive,fOptArea,fVerbose);
    Gia_ManTransferTiming(p_03,p);
  }
  else {
    local_38 = (Tim_Man_t *)p->pManTime;
    pTVar2 = Tim_ManDup(local_38,0x10);
    p->pManTime = pTVar2;
    p_00 = Gia_ManDupUnnormalize(p);
    if (p_00 == (Gia_Man_t *)0x0) {
      p_03 = (Gia_Man_t *)0x0;
    }
    else {
      Gia_ManTransferTiming(p_00,p);
      p_01 = Str_ManNormalize(p_00);
      p_02 = Str_NtkBalance(p_00,p_01,nLutSize,fUseMuxes,fRecursive,fOptArea,fVerbose);
      Gia_ManTransferTiming(p_02,p_00);
      Gia_ManStop(p_00);
      p_03 = Gia_ManDupNormalize(p_02,0);
      Gia_ManTransferTiming(p_03,p_02);
      Gia_ManStop(p_02);
      Tim_ManStop((Tim_Man_t *)p_03->pManTime);
      p_03->pManTime = local_38;
      iVar1 = Gia_ManIsNormalized(p_03);
      if (iVar1 == 0) {
        __assert_fail("Gia_ManIsNormalized(pNew)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaStr.c"
                      ,0x57c,"Gia_Man_t *Gia_ManLutBalance(Gia_Man_t *, int, int, int, int, int)");
      }
    }
    if (p_00 == (Gia_Man_t *)0x0) {
      return (Gia_Man_t *)0x0;
    }
  }
  if (fVerbose != 0) {
    iVar1 = clock_gettime(3,&local_48);
    if (iVar1 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    iVar1 = 0xa4cb0a;
    printf("Network contains %d ands, %d xors, %d muxes (%d trees in %d groups).  ",
           (ulong)(uint)p_01->nObjCount[3],(ulong)(uint)p_01->nObjCount[4],
           (ulong)(uint)p_01->nObjCount[5],(ulong)(uint)p_01->nTrees,(ulong)(uint)p_01->nGroups);
    Abc_Print(iVar1,"%s =","Time");
    Abc_Print(iVar1,"%9.2f sec\n",(double)(lVar4 + lVar3) / 1000000.0);
  }
  __ptr = (p_01->vFanins).pArray;
  if (__ptr != (int *)0x0) {
    free(__ptr);
    (p_01->vFanins).pArray = (int *)0x0;
  }
  if (p_01->pObjs != (Str_Obj_t *)0x0) {
    free(p_01->pObjs);
    p_01->pObjs = (Str_Obj_t *)0x0;
  }
  if (p_01 != (Str_Ntk_t *)0x0) {
    free(p_01);
  }
  return p_03;
}

Assistant:

Gia_Man_t * Gia_ManLutBalance( Gia_Man_t * p, int nLutSize, int fUseMuxes, int fRecursive, int fOptArea, int fVerbose )
{
    Str_Ntk_t * pNtk;
    Gia_Man_t * pNew;
    abctime clk = Abc_Clock();
    if ( p->pManTime && Tim_ManBoxNum((Tim_Man_t*)p->pManTime) && Gia_ManIsNormalized(p) )
    {
        Tim_Man_t * pTimOld = (Tim_Man_t *)p->pManTime;
        p->pManTime = Tim_ManDup( pTimOld, 16 );
        pNew = Gia_ManDupUnnormalize( p );
        if ( pNew == NULL )
            return NULL;
        Gia_ManTransferTiming( pNew, p );
        p = pNew;
        // optimize
        pNtk = Str_ManNormalize( p );
        pNew = Str_NtkBalance( p, pNtk, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        // normalize
        pNew = Gia_ManDupNormalize( p = pNew, 0 );
        Gia_ManTransferTiming( pNew, p );
        Gia_ManStop( p );
        // cleanup
        Tim_ManStop( (Tim_Man_t *)pNew->pManTime );
        pNew->pManTime = pTimOld;
        assert( Gia_ManIsNormalized(pNew) );
    }
    else 
    {
        pNtk = Str_ManNormalize( p );
    //    Str_NtkPrintGroups( pNtk );
        pNew = Str_NtkBalance( p, pNtk, nLutSize, fUseMuxes, fRecursive, fOptArea, fVerbose );
        Gia_ManTransferTiming( pNew, p );
    }
    if ( fVerbose )
        Str_NtkPs( pNtk, Abc_Clock() - clk );
    Str_NtkDelete( pNtk );   
    return pNew;
}